

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double levy_cdf(double x,double a,double b)

{
  double x_00;
  double local_28;
  double cdf;
  double b_local;
  double a_local;
  double x_local;
  
  if (b <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEVY_CDF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  B <= 0.0.\n");
    exit(1);
  }
  if (a < x) {
    x_00 = sqrt(b / ((x - a) * 2.0));
    local_28 = r8_error_f(x_00);
    local_28 = 1.0 - local_28;
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

double levy_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    LEVY_CDF evaluates the Levy CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 April 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//    Normally, A <= X.
//
//    Input, double A, B, the parameters of the PDF.
//    0 < B.
//
//    Output, double LEVY_CDF, the value of the PDF.
//
{
  double cdf;

  if ( b <= 0.0 )
  {
    cerr << "\n";
    cerr << "LEVY_CDF - Fatal error!\n";
    cerr << "  B <= 0.0.\n";
    exit ( 1 );
  }

  if ( x <= a )
  {
    cdf = 0.0;
  }
  else
  {
    cdf = 1.0 - r8_error_f ( sqrt ( b / ( 2.0 * ( x - a ) ) ) );
  }

  return cdf;
}